

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::LookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,
          MapValueConstRef *val)

{
  bool bVar1;
  CppType type;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  MapFieldBase *this_02;
  MapValueConstRef *val_local;
  MapKey *key_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  bVar1 = anon_unknown_6::IsMapFieldInApi(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"LookupMapValue","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  this_01 = Descriptor::map_value(this_00);
  type = FieldDescriptor::cpp_type(this_01);
  MapValueConstRef::SetType(val,type);
  this_02 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
  bVar1 = internal::MapFieldBase::LookupMapValue(this_02,key,val);
  return bVar1;
}

Assistant:

bool Reflection::LookupMapValue(const Message& message,
                                const FieldDescriptor* field, const MapKey& key,
                                MapValueConstRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), LookupMapValue,
              "Field is not a map field.");
  val->SetType(field->message_type()->map_value()->cpp_type());
  return GetRaw<MapFieldBase>(message, field).LookupMapValue(key, val);
}